

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_asn1_bool(CBS *cbs,int *out)

{
  int iVar1;
  int iVar2;
  CBS bytes;
  CBS local_18;
  
  iVar1 = cbs_get_asn1(cbs,&local_18,1,1);
  iVar2 = 0;
  if (((iVar1 != 0) && (local_18.len == 1)) && (0xfd < (byte)(*local_18.data - 1))) {
    *out = (uint)(*local_18.data != '\0');
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CBS_get_asn1_bool(CBS *cbs, int *out) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, CBS_ASN1_BOOLEAN) || CBS_len(&bytes) != 1) {
    return 0;
  }

  const uint8_t value = *CBS_data(&bytes);
  if (value != 0 && value != 0xff) {
    return 0;
  }

  *out = !!value;
  return 1;
}